

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O3

void external_editor_timer(void *param_1)

{
  int iVar1;
  int iVar2;
  Fl_Code_Type *code;
  Fl_Code_Type *this;
  int modified;
  
  iVar1 = ExternalCodeEditor::editors_open();
  if (G_debug != 0) {
    printf("--- TIMER --- External editors open=%d\n");
  }
  if (Fl_Type::first != (Fl_Type *)0x0 && 0 < iVar1) {
    iVar1 = 0;
    this = (Fl_Code_Type *)Fl_Type::first;
    do {
      iVar2 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x22])(this);
      if (iVar2 != 0) {
        iVar2 = Fl_Code_Type::handle_editor_changes(this);
        iVar1 = (iVar1 + 1) - (uint)(iVar2 == 0);
        iVar2 = ExternalCodeEditor::is_editing(&this->editor_);
        if (iVar2 != 0) {
          ExternalCodeEditor::reap_editor(&this->editor_);
        }
      }
      this = (Fl_Code_Type *)(this->super_Fl_Type).next;
    } while (this != (Fl_Code_Type *)0x0);
    if (iVar1 != 0) {
      set_modflag(1);
    }
  }
  iVar1 = ExternalCodeEditor::editors_open();
  if (iVar1 != 0) {
    Fl::repeat_timeout(2.0,external_editor_timer,(void *)0x0);
    return;
  }
  return;
}

Assistant:

static void external_editor_timer(void*) {
  int editors_open = ExternalCodeEditor::editors_open();
  if ( G_debug ) printf("--- TIMER --- External editors open=%d\n", editors_open);
  if ( editors_open > 0 ) {
    // Walk tree looking for files modified by external editors.
    int modified = 0;
    for (Fl_Type *p = Fl_Type::first; p; p = p->next) {
      if ( p->is_code() ) {
        Fl_Code_Type *code = (Fl_Code_Type*)p;
        // Code changed by external editor?
        if ( code->handle_editor_changes() ) {	// updates ram, file size/mtime
          modified++;
        }
        if ( code->is_editing() ) {             // editor open?
          code->reap_editor();                  // Try to reap; maybe it recently closed
        }
      }
    }
    if ( modified ) set_modflag(1);
  }
  // Repeat timeout if editors still open
  //    The ExternalCodeEditor class handles start/stopping timer, we just
  //    repeat_timeout() if it's already on. NOTE: above code may have reaped
  //    only open editor, which would disable further timeouts. So *recheck*
  //    if editors still open, to ensure we don't accidentally re-enable them.
  //
  if ( ExternalCodeEditor::editors_open() ) {
    Fl::repeat_timeout(2.0, external_editor_timer);
  }
}